

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O3

bool __thiscall
draco::RAnsSymbolDecoder<18>::Create(RAnsSymbolDecoder<18> *this,DecoderBuffer *buffer)

{
  byte bVar1;
  pointer puVar2;
  pointer prVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *this_00;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong __new_size;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  
  if (buffer->bitstream_version_ == 0) {
    return false;
  }
  if (buffer->bitstream_version_ < 0x200) {
    if (buffer->pos_ + 4 <= buffer->data_size_) {
      uVar13 = *(uint *)(buffer->data_ + buffer->pos_);
      this->num_symbols_ = uVar13;
      lVar11 = buffer->pos_ + 4;
      buffer->pos_ = lVar11;
LAB_00158ada:
      if ((long)(ulong)(uVar13 >> 6) <= buffer->data_size_ - lVar11) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->probability_table_,(ulong)uVar13);
        __new_size = (ulong)this->num_symbols_;
        if (this->num_symbols_ == 0) {
          uVar9 = 1;
        }
        else {
          lVar11 = buffer->data_size_;
          lVar12 = buffer->pos_;
          puVar2 = (this->probability_table_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = 0;
          do {
            lVar19 = lVar12 + 1;
            if (lVar11 < lVar19) goto LAB_00158aeb;
            bVar10 = buffer->data_[lVar12];
            buffer->pos_ = lVar19;
            uVar15 = (uint)(bVar10 >> 2);
            uVar9 = (ulong)uVar15;
            uVar18 = bVar10 & 3;
            if ((bVar10 & 3) == 0) {
LAB_00158b96:
              puVar2[uVar13] = uVar15;
              lVar12 = lVar19;
              uVar15 = uVar13;
            }
            else {
              if (uVar18 != 3) {
                bVar10 = 6;
                lVar12 = lVar19;
                do {
                  lVar19 = lVar12 + 1;
                  if (lVar11 < lVar19) goto LAB_00158aeb;
                  bVar1 = buffer->data_[lVar12];
                  buffer->pos_ = lVar19;
                  uVar15 = (uint)uVar9 | (uint)bVar1 << (bVar10 & 0x1f);
                  uVar9 = (ulong)uVar15;
                  bVar10 = bVar10 + 8;
                  uVar18 = uVar18 - 1;
                  lVar12 = lVar19;
                } while (uVar18 != 0);
                goto LAB_00158b96;
              }
              uVar15 = uVar15 + uVar13;
              if ((uint)__new_size <= uVar15) goto LAB_00158aeb;
              lVar16 = uVar9 + 1;
              do {
                puVar2[uVar13] = 0;
                uVar13 = uVar13 + 1;
                lVar16 = lVar16 + -1;
                lVar12 = lVar19;
              } while (lVar16 != 0);
            }
            uVar13 = uVar15 + 1;
            uVar15 = this->num_symbols_;
            __new_size = (ulong)uVar15;
          } while (uVar13 < uVar15);
          puVar2 = (this->probability_table_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&(this->ans_).lut_table_,0x100000);
          this_00 = &(this->ans_).probability_table_;
          std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize(this_00,__new_size)
          ;
          auVar7 = _DAT_00160830;
          auVar6 = _DAT_00160820;
          auVar5 = _DAT_0015f620;
          uVar9 = 0;
          if (uVar15 != 0) {
            prVar3 = (this_00->super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (this->ans_).lut_table_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            do {
              prVar3[uVar14].prob = puVar2[uVar14];
              uVar13 = (uint)uVar9;
              prVar3[uVar14].cum_prob = uVar13;
              uVar15 = puVar2[uVar14] + uVar13;
              if (0x100000 < uVar15) goto LAB_00158aeb;
              if (uVar13 < uVar15) {
                lVar11 = (uVar15 - uVar9) + -1;
                auVar20._8_4_ = (int)lVar11;
                auVar20._0_8_ = lVar11;
                auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
                auVar20 = auVar20 ^ auVar5;
                uVar17 = 0;
                do {
                  auVar22._8_4_ = (int)uVar17;
                  auVar22._0_8_ = uVar17;
                  auVar22._12_4_ = (int)(uVar17 >> 0x20);
                  auVar23 = (auVar22 | auVar7) ^ auVar5;
                  iVar21 = auVar20._4_4_;
                  uVar13 = (uint)uVar14;
                  if ((bool)(~(iVar21 < auVar23._4_4_ ||
                              auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar21) & 1)) {
                    puVar4[uVar9 + uVar17] = uVar13;
                  }
                  if (auVar23._12_4_ <= auVar20._12_4_ &&
                      (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
                    puVar4[uVar9 + uVar17 + 1] = uVar13;
                  }
                  auVar22 = (auVar22 | auVar6) ^ auVar5;
                  iVar24 = auVar22._4_4_;
                  if (iVar24 <= iVar21 && (iVar24 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
                    puVar4[uVar9 + uVar17 + 2] = uVar13;
                    puVar4[uVar9 + uVar17 + 3] = uVar13;
                  }
                  uVar17 = uVar17 + 4;
                } while (((uVar15 - uVar9) + 3 & 0xfffffffffffffffc) != uVar17);
              }
              uVar14 = uVar14 + 1;
              uVar9 = (ulong)uVar15;
            } while (uVar14 != __new_size);
            uVar9 = (ulong)(uVar15 == 0x100000);
          }
        }
        goto LAB_00158aed;
      }
    }
  }
  else {
    bVar8 = anon_unknown_52::DecodeVarintUnsigned<unsigned_int>(1,&this->num_symbols_,buffer);
    if (bVar8) {
      uVar13 = this->num_symbols_;
      lVar11 = buffer->pos_;
      goto LAB_00158ada;
    }
  }
LAB_00158aeb:
  uVar9 = 0;
LAB_00158aed:
  return SUB81(uVar9,0);
}

Assistant:

uint16_t bitstream_version() const { return bitstream_version_; }